

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal
          (ChElementBeamTaperedTimoshenko *this,bool inertial_damping,bool inertial_stiffness)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer psVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *peVar9;
  double *pdVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ChVector<double> mW_B;
  ChVector<double> mW_A;
  ChVector<double> mWvel_B;
  ChVector<double> mWacc_B;
  ChMatrixNM<double,_12,_12> mH;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  double local_590;
  undefined1 *puStack_588;
  undefined1 local_580 [24];
  undefined1 local_568 [24];
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined1 local_530 [24];
  undefined1 local_518 [24];
  undefined1 local_500 [1240];
  
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x2ef,
                  "void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal(bool, bool)"
                 );
  }
  if (inertial_damping) {
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var8 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar7->super_ChNodeFEAbase).field_0x18);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar7->super_ChNodeFEAbase).field_0x18);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    peVar9 = (this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar9->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[3])
              (peVar9,local_500,local_568,local_580);
    local_5b0._8_8_ = local_500;
    local_5b0._0_8_ = (this->super_ChElementBeam).length * 0.5;
    auVar2 = local_5b0;
    if ((((this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows != 0xc) ||
        ((this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_cols != 0xc)) &&
       ((Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                   ((DenseStorage<double,__1,__1,__1,_1> *)&this->Ri,0x90,0xc,0xc),
        (this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        != 0xc || ((this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols != 0xc)))) goto LAB_0066e390;
    pdVar10 = (this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data;
    lVar16 = vpextrq_avx(auVar2,1);
    auVar18 = vpbroadcastq_avx512f(auVar2);
    uVar17 = 0xfffffffffffffff8;
    do {
      auVar19 = vmulpd_avx512f(auVar18,*(undefined1 (*) [64])(lVar16 + 0x40 + uVar17 * 8));
      *(undefined1 (*) [64])(pdVar10 + uVar17 + 8) = auVar19;
      uVar17 = uVar17 + 8;
    } while (uVar17 < 0x88);
  }
  else {
    iVar14 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    iVar15 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
              (&(this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (long)iVar14,(long)iVar15);
  }
  if (inertial_stiffness) {
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var8 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar7->super_ChNodeFEAbase).field_0x18);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var8 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWacc_loc
              ((ChFrameMoving<double> *)&(peVar7->super_ChNodeFEAbase).field_0x18);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var8 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
              ._M_ptr;
    p_Var12 = (psVar6->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
              ._M_refcount._M_pi;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
    }
    dVar1 = *(double *)&peVar11->field_0xe0;
    auVar24._8_8_ = *(undefined8 *)&peVar11->field_0xd8;
    auVar24._0_8_ = *(undefined8 *)&peVar11->field_0xd8;
    auVar26._8_8_ = *(undefined8 *)&peVar11->field_0xe8;
    auVar26._0_8_ = *(undefined8 *)&peVar11->field_0xe8;
    auVar20._0_8_ = dVar1 * *(double *)&peVar7->field_0x70;
    auVar20._8_8_ = dVar1 * *(double *)&peVar7->field_0x78;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)&peVar7->field_0x68;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar1 * *(double *)&peVar7->field_0x80;
    auVar22 = vfmadd231sd_fma(auVar22,auVar24,auVar2);
    auVar2 = vfmadd231pd_fma(auVar20,auVar24,*(undefined1 (*) [16])&peVar7->field_0x58);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)&peVar7->field_0x98;
    auVar3 = vfmadd231sd_fma(auVar22,auVar26,auVar3);
    local_5b0 = vfmadd231pd_fma(auVar2,auVar26,*(undefined1 (*) [16])&peVar7->field_0x88);
    local_5a0 = auVar3._0_8_;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWvel_loc
              ((ChFrameMoving<double> *)&(peVar7->super_ChNodeFEAbase).field_0x18);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    ChFrameMoving<double>::GetWacc_loc
              ((ChFrameMoving<double> *)&(peVar7->super_ChNodeFEAbase).field_0x18);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar7 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    psVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar11 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    p_Var12 = psVar6[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
    }
    dVar1 = *(double *)&peVar11->field_0xe0;
    auVar25._8_8_ = *(undefined8 *)&peVar11->field_0xd8;
    auVar25._0_8_ = *(undefined8 *)&peVar11->field_0xd8;
    auVar27._8_8_ = *(undefined8 *)&peVar11->field_0xe8;
    auVar27._0_8_ = *(undefined8 *)&peVar11->field_0xe8;
    auVar21._0_8_ = dVar1 * *(double *)&peVar7->field_0x70;
    auVar21._8_8_ = dVar1 * *(double *)&peVar7->field_0x78;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)&peVar7->field_0x68;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar1 * *(double *)&peVar7->field_0x80;
    auVar3 = vfmadd231sd_fma(auVar23,auVar25,auVar4);
    auVar2 = vfmadd231pd_fma(auVar21,auVar25,*(undefined1 (*) [16])&peVar7->field_0x58);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)&peVar7->field_0x98;
    auVar3 = vfmadd231sd_fma(auVar3,auVar27,auVar5);
    local_550 = vfmadd231pd_fma(auVar2,auVar27,*(undefined1 (*) [16])&peVar7->field_0x88);
    local_540 = auVar3._0_8_;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    peVar9 = (this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar9->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[4])
              (peVar9,local_500,local_568,local_580,local_5b0,local_530,local_518,local_550);
    local_590 = (this->super_ChElementBeam).length * 0.5;
    auVar13._8_8_ = local_500;
    auVar13._0_8_ = local_590;
    if ((((this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows != 0xc) ||
        ((this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_cols != 0xc)) &&
       ((puStack_588 = local_500,
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)&this->Ki,0x90,0xc,0xc),
        (this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        != 0xc || ((this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols != 0xc)))) {
LAB_0066e390:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 12, 12, 1>>, const Eigen::Matrix<double, 12, 12, 1>>, T1 = double, T2 = double]"
                   );
    }
    pdVar10 = (this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data;
    lVar16 = vpextrq_avx(auVar13,1);
    auVar18 = vpbroadcastq_avx512f(auVar13);
    uVar17 = 0xfffffffffffffff8;
    do {
      auVar19 = vmulpd_avx512f(auVar18,*(undefined1 (*) [64])(lVar16 + 0x40 + uVar17 * 8));
      *(undefined1 (*) [64])(pdVar10 + uVar17 + 8) = auVar19;
      uVar17 = uVar17 + 8;
    } while (uVar17 < 0x88);
  }
  else {
    iVar14 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    iVar15 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
              (&(this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (long)iVar14,(long)iVar15);
  }
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal(bool inertial_damping, bool inertial_stiffness) {
    assert(tapered_section);

    if (inertial_damping) {
        ChVector<> mW_A = this->GetNodeA()->GetWvel_loc();
        ChVector<> mW_B = this->GetNodeB()->GetWvel_loc();
        ChMatrixNM<double, 12, 12> mH;
        this->tapered_section->ComputeInertiaDampingMatrix(mH, mW_A, mW_B);
        this->Ri = 0.5 * this->length * mH;
    } else {
        this->Ri.setZero(this->GetNdofs(), this->GetNdofs());
    }

    if (inertial_stiffness) {
        // current angular velocity of section of node A, in material frame
        ChVector<> mWvel_A = this->GetNodeA()->GetWvel_loc();
        // current angular acceleration of section of node A, in material frame
        ChVector<> mWacc_A = this->GetNodeA()->GetWacc_loc();
        // current acceleration of section of node A, in material frame)
        ChVector<> mXacc_A = this->GetNodeA()->TransformDirectionParentToLocal(this->GetNodeA()->GetPos_dtdt());
        // current angular velocity of section of node B, in material frame
        ChVector<> mWvel_B = this->GetNodeB()->GetWvel_loc();
        // current angular acceleration of section of node B, in material frame
        ChVector<> mWacc_B = this->GetNodeB()->GetWacc_loc();
        // current acceleration of section of node B, in material frame
        ChVector<> mXacc_B = this->GetNodeB()->TransformDirectionParentToLocal(this->GetNodeB()->GetPos_dtdt());

        ChMatrixNM<double, 12, 12> mH;
        this->tapered_section->ComputeInertiaStiffnessMatrix(mH, mWvel_A, mWacc_A, mXacc_A, mWvel_B, mWacc_B, mXacc_B);
        this->Ki = 0.5 * this->length * mH;
    } else {
        this->Ki.setZero(this->GetNdofs(), this->GetNdofs());
    }
}